

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestCase.cpp
# Opt level: O0

ConstTestNodeIterator * __thiscall
xe::ConstTestNodeIterator::operator++(ConstTestNodeIterator *this)

{
  TestGroup *this_00;
  bool bVar1;
  int iVar2;
  reference pvVar3;
  int *piVar4;
  int local_5c;
  int numChildren;
  int *childNdx;
  TestGroup *group;
  TestNodeType local_1c;
  TestGroup *pTStack_18;
  TestNodeType curNodeType;
  TestNode *curNode;
  ConstTestNodeIterator *this_local;
  
  curNode = (TestNode *)this;
  pTStack_18 = (TestGroup *)operator*(this);
  local_1c = TestNode::getNodeType((TestNode *)pTStack_18);
  if (((local_1c == TESTNODETYPE_GROUP) || (local_1c == TESTNODETYPE_ROOT)) &&
     (iVar2 = TestGroup::getNumChildren(pTStack_18), 0 < iVar2)) {
    GroupState::GroupState((GroupState *)&group,pTStack_18);
    std::
    vector<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
    ::push_back(&this->m_iterStack,(value_type *)&group);
  }
  else {
    do {
      pvVar3 = std::
               vector<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
               ::back(&this->m_iterStack);
      this_00 = pvVar3->group;
      pvVar3 = std::
               vector<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
               ::back(&this->m_iterStack);
      piVar4 = &pvVar3->childNdx;
      if (this_00 == (TestGroup *)0x0) {
        local_5c = 1;
      }
      else {
        local_5c = TestGroup::getNumChildren(this_00);
      }
      *piVar4 = *piVar4 + 1;
      if (*piVar4 != local_5c) {
        return this;
      }
      std::
      vector<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
      ::pop_back(&this->m_iterStack);
      bVar1 = std::
              vector<xe::ConstTestNodeIterator::GroupState,_std::allocator<xe::ConstTestNodeIterator::GroupState>_>
              ::empty(&this->m_iterStack);
    } while (!bVar1);
  }
  return this;
}

Assistant:

ConstTestNodeIterator& ConstTestNodeIterator::operator++ (void)
{
	DE_ASSERT(!m_iterStack.empty());

	const TestNode*	curNode			= **this;
	TestNodeType	curNodeType		= curNode->getNodeType();

	if ((curNodeType == TESTNODETYPE_GROUP || curNodeType == TESTNODETYPE_ROOT) &&
		static_cast<const TestGroup*>(curNode)->getNumChildren() > 0)
	{
		m_iterStack.push_back(GroupState(static_cast<const TestGroup*>(curNode)));
	}
	else
	{
		for (;;)
		{
			const TestGroup*	group		= m_iterStack.back().group;
			int&				childNdx	= m_iterStack.back().childNdx;
			int					numChildren	= group ? group->getNumChildren() : 1;

			childNdx += 1;
			if (childNdx == numChildren)
			{
				m_iterStack.pop_back();
				if (m_iterStack.empty())
					break;
			}
			else
				break;
		}
	}

	return *this;
}